

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readRequestAllowingConnect(HttpInputStreamImpl *this)

{
  ArrayDisposer *pAVar1;
  size_t sVar2;
  Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  SourceLocation location;
  undefined8 uVar6;
  bool bVar7;
  coroutine_handle<void> handle;
  undefined8 in_RSI;
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  Fault f;
  undefined1 local_a0 [56];
  Own<kj::AsyncInputStream,_std::nullptr_t> local_68;
  undefined4 local_50 [4];
  undefined4 local_40 [2];
  undefined4 local_38;
  
  handle._M_fr_ptr = operator_new(0x530);
  *(code **)handle._M_fr_ptr = readRequestAllowingConnect;
  *(code **)((long)handle._M_fr_ptr + 8) = readRequestAllowingConnect;
  this_00 = (Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *)
            ((long)handle._M_fr_ptr + 0x10);
  *(undefined8 *)((long)handle._M_fr_ptr + 0x520) = in_RSI;
  local_a0._24_4_ = 0x43b3c6;
  local_a0._28_4_ = 0;
  local_a0._32_4_ = 0x43c980;
  local_a0._36_4_ = 0;
  local_a0._40_8_ = (ArrayDisposer *)0x2c00000593;
  location.function = "readRequestAllowingConnect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x593;
  location.columnNumber = 0x2c;
  kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
  Coroutine(this_00,handle,location);
  local_a0._16_8_ = this;
  kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
  get_return_object((Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
                     *)this);
  this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x518);
  readRequestHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)((long)handle._M_fr_ptr + 0x270);
  co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x528) = 0;
  bVar7 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar7) {
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                    *)((long)handle._M_fr_ptr + 0x468),__return_storage_ptr__);
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    uVar3 = ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              *)((long)handle._M_fr_ptr + 0x468))->tag;
    if (uVar3 == 1) {
      local_40[0] = 1;
      local_38 = *(undefined4 *)((long)handle._M_fr_ptr + 0x470);
      sVar2 = *(long *)((long)handle._M_fr_ptr + 0x520) + 0x48;
      getEntityBody((HttpInputStreamImpl *)local_a0,
                    (RequestOrResponse)*(long *)((long)handle._M_fr_ptr + 0x520),
                    (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)local_40,
                    (HttpHeaders *)0x0);
      uVar4 = local_a0._8_8_;
      local_40[0] = 0;
      local_a0._24_4_ = *(undefined4 *)((long)handle._M_fr_ptr + 0x470);
      local_a0._40_8_ = *(undefined8 *)((long)handle._M_fr_ptr + 0x480);
      local_a0._32_4_ = (undefined4)*(undefined8 *)((long)handle._M_fr_ptr + 0x478);
      local_a0._36_4_ = (undefined4)((ulong)*(undefined8 *)((long)handle._M_fr_ptr + 0x478) >> 0x20)
      ;
      local_68.disposer = (Disposer *)local_a0._0_8_;
      local_a0._8_8_ = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
      *(undefined4 *)((long)handle._M_fr_ptr + 0x4a8) = 1;
      *(undefined4 *)((long)handle._M_fr_ptr + 0x4b0) = local_a0._24_4_;
      *(ulong *)((long)handle._M_fr_ptr + 0x4b4) = CONCAT44(local_a0._32_4_,local_a0._28_4_);
      *(undefined4 *)((long)handle._M_fr_ptr + 0x4bc) = local_a0._36_4_;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4c0) = local_a0._40_8_;
      *(size_t *)((long)handle._M_fr_ptr + 0x4c8) = sVar2;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4d0) = local_a0._0_8_;
      ((Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> *)
      ((long)handle._M_fr_ptr + 0x4d8))->ptr =
           (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)uVar4;
      local_68.ptr = (AsyncInputStream *)0x0;
      local_a0._48_8_ = sVar2;
      kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
      fulfill(this_00,(OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                      ((long)handle._M_fr_ptr + 0x4a8));
      OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::~OneOf
                ((OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                 ((long)handle._M_fr_ptr + 0x4a8));
      Own<kj::AsyncInputStream,_std::nullptr_t>::dispose(&local_68);
      Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_a0);
    }
    else {
      if (uVar3 != 2) {
        if (uVar3 == 3) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
                    ((Fault *)(local_a0 + 0x18),
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x59f,FAILED,(char *)0x0,"\"bad request\"",(char (*) [12])"bad request");
          kj::_::Debug::Fault::fatal((Fault *)(local_a0 + 0x18));
        }
        kj::_::unreachable();
      }
      local_50[0] = 2;
      pAVar1 = (ArrayDisposer *)(*(long *)((long)handle._M_fr_ptr + 0x520) + 0x48);
      getEntityBody((HttpInputStreamImpl *)local_a0,
                    (RequestOrResponse)*(long *)((long)handle._M_fr_ptr + 0x520),
                    (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)local_50,
                    (HttpHeaders *)0x0);
      uVar6 = local_a0._8_8_;
      local_50[0] = 0;
      uVar4 = *(undefined8 *)((long)handle._M_fr_ptr + 0x470);
      uVar5 = *(undefined8 *)((long)handle._M_fr_ptr + 0x478);
      local_a0._24_4_ = (undefined4)uVar4;
      local_a0._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      local_a0._32_4_ = (undefined4)uVar5;
      local_a0._36_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      local_a0._8_8_ = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
      local_a0._48_8_ = local_a0._0_8_;
      *(undefined4 *)((long)handle._M_fr_ptr + 0x4e0) = 2;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4e8) = uVar4;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4f0) = uVar5;
      *(ArrayDisposer **)((long)handle._M_fr_ptr + 0x4f8) = pAVar1;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x500) = local_a0._0_8_;
      ((Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> *)
      ((long)handle._M_fr_ptr + 0x508))->ptr =
           (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)uVar6;
      local_68.disposer = (Disposer *)0x0;
      local_a0._40_8_ = pAVar1;
      kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
      fulfill(this_00,(OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                      ((long)handle._M_fr_ptr + 0x4e0));
      OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::~OneOf
                ((OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                 ((long)handle._M_fr_ptr + 0x4e0));
      Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncInputStream,_std::nullptr_t> *)(local_a0 + 0x30));
      Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_a0);
    }
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x528) = 1;
  }
  return (Promise<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>)
         (PromiseNode *)local_a0._16_8_;
}

Assistant:

kj::Promise<kj::OneOf<Request, Connect>> readRequestAllowingConnect() override {
    auto requestOrProtocolError = co_await readRequestHeaders();
    KJ_SWITCH_ONEOF(requestOrProtocolError) {
      KJ_CASE_ONEOF(request, HttpHeaders::Request) {
        auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);
        co_return HttpInputStream::Request { request.method, request.url, headers, kj::mv(body) };
      }
      KJ_CASE_ONEOF(request, HttpHeaders::ConnectRequest) {
        auto body = getEntityBody(HttpInputStreamImpl::REQUEST, HttpConnectMethod(), 0, headers);
        co_return HttpInputStream::Connect { request.authority, headers, kj::mv(body) };
      }
      KJ_CASE_ONEOF(error, HttpHeaders::ProtocolError) {
        KJ_FAIL_REQUIRE("bad request");
      }
    }
    KJ_UNREACHABLE;
  }